

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-all.cc
# Opt level: O2

void testing::internal::ReportInvalidTestCaseType(char *test_case_name,char *file,int line)

{
  FILE *__stream;
  Message *pMVar1;
  int in_ECX;
  Message errors;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_68;
  char *local_60;
  string local_58;
  string local_38;
  
  local_60 = test_case_name;
  Message::Message((Message *)&local_68);
  std::operator<<((ostream *)(local_68.ptr_ + 0x10),"Attempted redefinition of test case ");
  pMVar1 = Message::operator<<((Message *)&local_68,&local_60);
  pMVar1 = Message::operator<<(pMVar1,(char (*) [3])0x138544);
  pMVar1 = Message::operator<<(pMVar1,(char (*) [64])
                                      "All tests in the same test case must use the same test fixture\n"
                              );
  pMVar1 = Message::operator<<(pMVar1,(char (*) [31])"class.  However, in test case ");
  pMVar1 = Message::operator<<(pMVar1,&local_60);
  pMVar1 = Message::operator<<(pMVar1,(char (*) [13])", you tried\n");
  pMVar1 = Message::operator<<(pMVar1,(char (*) [63])
                                      "to define a test using a fixture class different from the one\n"
                              );
  pMVar1 = Message::operator<<(pMVar1,(char (*) [62])
                                      "used earlier. This can happen if the two fixture classes are\n"
                              );
  pMVar1 = Message::operator<<(pMVar1,(char (*) [62])
                                      "from different namespaces and have the same name. You should\n"
                              );
  pMVar1 = Message::operator<<(pMVar1,(char (*) [68])
                                      "probably rename one of the classes to put the tests into different\n"
                              );
  Message::operator<<(pMVar1,(char (*) [12])0x13827c);
  __stream = _stderr;
  FormatFileLocation_abi_cxx11_(&local_58,(internal *)file,(char *)(ulong)(uint)line,in_ECX);
  StringStreamToString(&local_38,local_68.ptr_);
  fprintf(__stream,"%s %s",local_58._M_dataplus._M_p,local_38._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr(&local_68);
  return;
}

Assistant:

void ReportInvalidTestCaseType(const char* test_case_name,
                               const char* file, int line) {
  Message errors;
  errors
      << "Attempted redefinition of test case " << test_case_name << ".\n"
      << "All tests in the same test case must use the same test fixture\n"
      << "class.  However, in test case " << test_case_name << ", you tried\n"
      << "to define a test using a fixture class different from the one\n"
      << "used earlier. This can happen if the two fixture classes are\n"
      << "from different namespaces and have the same name. You should\n"
      << "probably rename one of the classes to put the tests into different\n"
      << "test cases.";

  fprintf(stderr, "%s %s", FormatFileLocation(file, line).c_str(),
          errors.GetString().c_str());
}